

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastDecoder(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int iLit1;
  int local_40;
  int iMint;
  int nMints;
  int k;
  int i;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vTmp_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  Vec_IntClear(vRes);
  for (nMints = 0; nMints < 1 << ((byte)nNum & 0x1f); nMints = nMints + 1) {
    local_40 = 1;
    for (iMint = 0; iMint < nNum; iMint = iMint + 1) {
      iLit1 = Abc_LitNotCond(pNum[iMint],
                             (uint)(((nMints >> ((byte)iMint & 0x1f) & 1U) != 0 ^ 0xffU) & 1));
      local_40 = Gia_ManHashAnd(pNew,local_40,iLit1);
    }
    Vec_IntPush(vRes,local_40);
  }
  return;
}

Assistant:

void Wlc_BlastDecoder( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int i, k, nMints = 1 << nNum;
    Vec_IntClear( vRes );
    for ( i = 0; i < nMints; i++ )
    {
        int iMint = 1;
        for ( k = 0; k < nNum; k++ )
            iMint = Gia_ManHashAnd( pNew, iMint, Abc_LitNotCond(pNum[k], !((i >> k) & 1)) );
        Vec_IntPush( vRes, iMint );
    }
}